

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ovf.cpp
# Opt level: O0

int ovf_close(ovf_file *ovf_file_ptr)

{
  parser_state *this;
  ovf_file *ovf_file_ptr_local;
  
  if (ovf_file_ptr == (ovf_file *)0x0) {
    ovf_file_ptr_local._4_4_ = -2;
  }
  else if (ovf_file_ptr->_state == (parser_state *)0x0) {
    ovf_file_ptr_local._4_4_ = -2;
  }
  else {
    this = ovf_file_ptr->_state;
    if (this != (parser_state *)0x0) {
      parser_state::~parser_state(this);
      operator_delete(this);
    }
    ovf_file_ptr_local._4_4_ = -1;
  }
  return ovf_file_ptr_local._4_4_;
}

Assistant:

int ovf_close(struct ovf_file * ovf_file_ptr)
try
{
    if( !ovf_file_ptr )
        return OVF_ERROR;
    if( !ovf_file_ptr->_state )
        return OVF_ERROR;
    delete(ovf_file_ptr->_state);
    return OVF_OK;
}
catch( ... )
{
    return OVF_ERROR;
}